

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_9195::verifyImagesAreEqual(FlatImage *img1,FlatImage *img2,int dx,int dy)

{
  int iVar1;
  int iVar2;
  ArgExc *pAVar3;
  ostream *poVar4;
  long *in_RSI;
  long *in_RDI;
  int in_stack_00000040;
  int in_stack_00000044;
  FlatImageLevel *in_stack_00000048;
  FlatImageLevel *in_stack_00000050;
  int x_1;
  int y;
  int x;
  int local_30;
  int local_2c;
  int local_28;
  
  iVar1 = Imf_3_2::Image::levelMode();
  iVar2 = Imf_3_2::Image::levelMode();
  if (iVar1 != iVar2) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar3,"different level modes");
    __cxa_throw(pAVar3,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iVar1 = Imf_3_2::Image::levelRoundingMode();
  iVar2 = Imf_3_2::Image::levelRoundingMode();
  if (iVar1 == iVar2) {
    iVar1 = Imf_3_2::Image::numXLevels();
    iVar2 = Imf_3_2::Image::numXLevels();
    if (iVar1 == iVar2) {
      iVar1 = Imf_3_2::Image::numYLevels();
      iVar2 = Imf_3_2::Image::numYLevels();
      if (iVar1 == iVar2) {
        iVar1 = Imf_3_2::Image::levelMode();
        if (iVar1 == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"        level 0");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          (**(code **)(*in_RDI + 0x20))(in_RDI,0);
          (**(code **)(*in_RSI + 0x20))(in_RSI,0);
          verifyLevelsAreEqual
                    (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
        }
        else if (iVar1 == 1) {
          for (local_28 = 0; iVar1 = Imf_3_2::Image::numLevels(), local_28 < iVar1;
              local_28 = local_28 + 1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"        level ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
            poVar4 = std::operator<<(poVar4,"");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            (**(code **)(*in_RDI + 0x20))(in_RDI,local_28);
            (**(code **)(*in_RSI + 0x20))(in_RSI,local_28);
            verifyLevelsAreEqual
                      (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
          }
        }
        else {
          if (iVar1 != 2) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                          ,0xa3,
                          "void (anonymous namespace)::verifyImagesAreEqual(const FlatImage &, const FlatImage &, int, int)"
                         );
          }
          for (local_2c = 0; iVar1 = Imf_3_2::Image::numYLevels(), local_2c < iVar1;
              local_2c = local_2c + 1) {
            for (local_30 = 0; iVar1 = Imf_3_2::Image::numXLevels(), local_30 < iVar1;
                local_30 = local_30 + 1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"        level (");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_30);
              poVar4 = std::operator<<(poVar4,", ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2c);
              poVar4 = std::operator<<(poVar4,")");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              (**(code **)(*in_RDI + 0x30))(in_RDI,local_30,local_2c);
              (**(code **)(*in_RSI + 0x30))(in_RSI,local_30,local_2c);
              verifyLevelsAreEqual
                        (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
            }
          }
        }
        return;
      }
    }
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar3,"different number of levels");
    __cxa_throw(pAVar3,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar3,"different level rounding modes");
  __cxa_throw(pAVar3,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyImagesAreEqual (
    const FlatImage& img1, const FlatImage& img2, int dx = 0, int dy = 0)
{
    if (img1.levelMode () != img2.levelMode ())
        throw ArgExc ("different level modes");

    if (img1.levelRoundingMode () != img2.levelRoundingMode ())
        throw ArgExc ("different level rounding modes");

    if (img1.numXLevels () != img2.numXLevels () ||
        img1.numYLevels () != img2.numYLevels ())
        throw ArgExc ("different number of levels");

    switch (img1.levelMode ())
    {
        case ONE_LEVEL:

            cout << "        level 0" << endl;

            verifyLevelsAreEqual (img1.level (), img2.level (), dx, dy);

            break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img1.numLevels (); ++x)
            {
                cout << "        level " << x << "" << endl;

                verifyLevelsAreEqual (img1.level (x), img2.level (x), dx, dy);
            }

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img1.numYLevels (); ++y)
            {
                for (int x = 0; x < img1.numXLevels (); ++x)
                {
                    cout << "        level (" << x << ", " << y << ")" << endl;

                    verifyLevelsAreEqual (
                        img1.level (x, y), img2.level (x, y), dx, dy);
                }
            }

            break;

        default: assert (false);
    }
}